

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

void __thiscall RString::SafeDealloc(RString *this)

{
  int iVar1;
  RString *in_RDI;
  int i;
  char local_c [12];
  
  if (in_RDI->myString != (char *)0x0) {
    iVar1 = RefCount(in_RDI);
    if (iVar1 < 1) {
      if (in_RDI->myString <= local_c) {
        in_RDI->myString = in_RDI->myString + -1;
        if (in_RDI->myString != (char *)0x0) {
          operator_delete__(in_RDI->myString);
        }
      }
    }
    else {
      iVar1 = RefCount(in_RDI);
      SetRefCount(in_RDI,iVar1 + -1);
      in_RDI->myString = (char *)0x0;
    }
  }
  return;
}

Assistant:

void RString::SafeDealloc(void)
{
	if(!myString)
		return;
	if(RefCount() > 0)
	{
		SetRefCount(RefCount() - 1);
		myString = nullptr;
		return;
	}
	//hack
	int i;
	if((int *)myString > &i)
		return;
	
	myString--;
	delete[] myString;
}